

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,_Bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  ImGuiContext_conflict *pIVar1;
  ImVec2 IVar2;
  float font_size;
  ImFont *font;
  char *text_display_end;
  ImGuiContext_conflict *g;
  float wrap_width_local;
  _Bool hide_text_after_double_hash_local;
  char *text_end_local;
  char *text_local;
  ImVec2 text_size;
  
  pIVar1 = GImGui;
  font = (ImFont *)text_end;
  if (hide_text_after_double_hash) {
    font = (ImFont *)FindRenderedTextEnd(text,text_end);
  }
  size = pIVar1->FontSize;
  if ((ImFont *)text == font) {
    ImVec2::ImVec2((ImVec2 *)&text_local,0.0,size);
  }
  else {
    IVar2 = ImFont::CalcTextSizeA
                      (pIVar1->Font,size,3.4028235e+38,wrap_width,text,(char *)font,(char **)0x0);
    text_local._0_4_ = IVar2.x;
    text_local = (char *)CONCAT44(IVar2.y,(float)(int)(text_local._0_4_ + 0.99999));
  }
  return (ImVec2)text_local;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Round
    // FIXME: This has been here since Dec 2015 (7b0bf230) but down the line we want this out.
    // FIXME: Investigate using ceilf or e.g.
    // - https://git.musl-libc.org/cgit/musl/tree/src/math/ceilf.c
    // - https://embarkstudios.github.io/rust-gpu/api/src/libm/math/ceilf.rs.html
    text_size.x = IM_FLOOR(text_size.x + 0.99999f);

    return text_size;
}